

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_filename_journal(char *zFilename)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_18;
  char *zFilename_local;
  
  if (zFilename == (char *)0x0) {
    zFilename_local = (char *)0x0;
  }
  else {
    local_18 = databaseName(zFilename);
    iVar1 = sqlite3Strlen30(local_18);
    local_18 = local_18 + (iVar1 + 1);
    while( true ) {
      bVar3 = false;
      if (local_18 != (char *)0x0) {
        bVar3 = *local_18 != '\0';
      }
      if (!bVar3) break;
      iVar1 = sqlite3Strlen30(local_18);
      iVar2 = sqlite3Strlen30(local_18 + (iVar1 + 1));
      local_18 = local_18 + (iVar1 + 1) + (iVar2 + 1);
    }
    zFilename_local = local_18 + 1;
  }
  return zFilename_local;
}

Assistant:

SQLITE_API const char *sqlite3_filename_journal(const char *zFilename){
  if( zFilename==0 ) return 0;
  zFilename = databaseName(zFilename);
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( ALWAYS(zFilename) && zFilename[0] ){
    zFilename += sqlite3Strlen30(zFilename) + 1;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return zFilename + 1;
}